

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestCycleInEdgesButNotInNodes3::Run(GraphTestCycleInEdgesButNotInNodes3 *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *node;
  allocator<char> local_71;
  string local_70;
  undefined4 local_50;
  ManifestParserOptions local_4c [3];
  int local_34;
  undefined1 local_30 [4];
  int fail_count;
  string err;
  GraphTestCycleInEdgesButNotInNodes3 *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  local_34 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(local_4c);
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build a b: cat c\nbuild c: cat a\n",local_4c[0]);
  iVar2 = local_34;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"b",&local_71);
    node = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
    bVar3 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,node,(string *)local_30);
    testing::Test::Check
              (pTVar1,(bool)(~bVar3 & 1),
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x175,"scan_.RecomputeDirty(GetNode(\"b\"), &err)");
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("dependency cycle: a -> c -> a",
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                       ,0x176,"\"dependency cycle: a -> c -> a\" == err");
    if (bVar3) {
      local_50 = 0;
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_50 = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    local_50 = 1;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(GraphTest, CycleInEdgesButNotInNodes3) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build a b: cat c\n"
"build c: cat a\n"));
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("b"), &err));
  ASSERT_EQ("dependency cycle: a -> c -> a", err);
}